

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFindPackageCommand.cxx
# Opt level: O0

string * __thiscall
anon_unknown.dwarf_ab50d4::cmMacProjectDirectoryListGenerator::TransformNameBeforeCmp
          (string *__return_storage_ptr__,cmMacProjectDirectoryListGenerator *this,string *name)

{
  cmAlphaNum local_80;
  cmAlphaNum local_50;
  string *local_20;
  string *name_local;
  cmMacProjectDirectoryListGenerator *this_local;
  
  local_20 = name;
  name_local = (string *)this;
  this_local = (cmMacProjectDirectoryListGenerator *)__return_storage_ptr__;
  cmAlphaNum::cmAlphaNum(&local_50,name);
  cmAlphaNum::cmAlphaNum(&local_80,this->Extension);
  cmStrCat<>(__return_storage_ptr__,&local_50,&local_80);
  return __return_storage_ptr__;
}

Assistant:

std::string TransformNameBeforeCmp(std::string name) override
  {
    return cmStrCat(name, this->Extension);
  }